

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O1

CodeLocation __thiscall soul::CodeLocation::createFromSourceFile(CodeLocation *this,SourceFile *f)

{
  pointer pcVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  CodeLocation CVar3;
  string local_60;
  string local_40;
  UTF8Reader UVar2;
  
  pcVar1 = (f->filename)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (f->filename)._M_string_length);
  pcVar1 = (f->content)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (f->content)._M_string_length);
  CVar3 = createFromString(this,&local_40,&local_60);
  UVar2 = CVar3.location.data;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    UVar2.data = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    UVar2.data = extraout_RDX_00;
  }
  CVar3.location.data = UVar2.data;
  CVar3.sourceCode.object = (SourceCodeText *)this;
  return CVar3;
}

Assistant:

CodeLocation CodeLocation::createFromSourceFile (const SourceFile& f)
{
    return createFromString (f.filename, f.content);
}